

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O0

void rcg::convYCbCr411toRGB(uint8_t *rgb,uint8_t *row,int i)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint in_EDX;
  long in_RSI;
  uchar *in_RDI;
  int bc;
  int gc;
  int rc;
  int Cr;
  int Cb;
  int Y;
  uint32_t js;
  uint32_t j;
  uint local_20;
  
  iVar3 = ((int)in_EDX >> 2) * 6;
  uVar4 = in_EDX & 3;
  bVar1 = *(byte *)(in_RSI + (ulong)(iVar3 + uVar4));
  if (1 < uVar4) {
    bVar1 = *(byte *)(in_RSI + (ulong)(iVar3 + uVar4 + 1));
  }
  local_20 = (uint)bVar1;
  iVar5 = *(byte *)(in_RSI + (ulong)(iVar3 + 2)) - 0x80;
  iVar3 = *(byte *)(in_RSI + (ulong)(iVar3 + 5)) - 0x80;
  uVar2 = anon_unknown_4::clamp8(local_20 + (iVar3 * 0x5a + 0x4020 >> 6) + -0x100);
  *in_RDI = uVar2;
  uVar2 = anon_unknown_4::clamp8(local_20 + (iVar5 * -0x16 + iVar3 * -0x2e + 0x4020 >> 6) + -0x100);
  in_RDI[1] = uVar2;
  uVar2 = anon_unknown_4::clamp8(local_20 + (iVar5 * 0x71 + 0x4020 >> 6) + -0x100);
  in_RDI[2] = uVar2;
  return;
}

Assistant:

void convYCbCr411toRGB(uint8_t rgb[3], const uint8_t *row, int i)
{
  const uint32_t j=static_cast<uint32_t>((i>>2)*6);
  const uint32_t js=static_cast<uint32_t>(i&0x3);

  int Y=row[j+js];
  if (js > 1)
  {
    Y=row[j+js+1];
  }

  const int Cb=static_cast<int>(row[j+2])-128;
  const int Cr=static_cast<int>(row[j+5])-128;

  // conversion of YCbCr into RGB with correct rounding
  const int rc=((90*Cr+16384+32)>>6)-256;
  const int gc=((-22*Cb-46*Cr+16384+32)>>6)-256;
  const int bc=((113*Cb+16384+32)>>6)-256;

  rgb[0]=clamp8(Y+rc);
  rgb[1]=clamp8(Y+gc);
  rgb[2]=clamp8(Y+bc);
}